

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_viewport.cpp
# Opt level: O2

bool __thiscall ON_Viewport::SetCameraDirection(ON_Viewport *this,ON_3dVector *v)

{
  double dVar1;
  ON_3dVector candidate_vector;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  bool bVar5;
  byte bVar6;
  double in_stack_ffffffffffffffe0;
  
  if (this->m_bLockCamDir == true) {
    uVar2 = (this->m_CamDir).y;
    uVar3 = (this->m_CamDir).z;
    candidate_vector.y = (double)uVar3;
    candidate_vector.x = (double)uVar2;
    candidate_vector.z = in_stack_ffffffffffffffe0;
    bVar5 = IsValidCameraUpOrDirection(candidate_vector);
    if (bVar5) {
      bVar5 = ON_3dVector::operator==(v,&this->m_CamDir);
      return bVar5;
    }
  }
  bVar5 = ON_3dVector::operator==(v,&ON_3dVector::UnsetVector);
  if (bVar5) {
    (this->m_CamDir).z = ON_3dVector::UnsetVector.z;
    dVar1 = ON_3dVector::UnsetVector.y;
    (this->m_CamDir).x = ON_3dVector::UnsetVector.x;
    (this->m_CamDir).y = dVar1;
    *(undefined4 *)((this->m_projection_content_sha1).m_digest + 0x10) =
         ON_SHA1_Hash::ZeroDigest.m_digest._16_4_;
    uVar4 = ON_SHA1_Hash::ZeroDigest.m_digest._8_8_;
    *(undefined8 *)(this->m_projection_content_sha1).m_digest =
         ON_SHA1_Hash::ZeroDigest.m_digest._0_8_;
    *(undefined8 *)((this->m_projection_content_sha1).m_digest + 8) = uVar4;
    bVar6 = 0;
    this->m_bValidCameraFrame = false;
    this->m_bValidCamera = false;
  }
  else {
    (this->m_CamDir).z = v->z;
    dVar1 = v->y;
    (this->m_CamDir).x = v->x;
    (this->m_CamDir).y = dVar1;
    SetCameraFrame(this);
    bVar6 = this->m_bValidCamera;
  }
  return (bool)(bVar6 & 1);
}

Assistant:

bool ON_Viewport::SetCameraDirection( const ON_3dVector& v )
{
  if ( m_bLockCamDir && ON_Viewport::IsValidCameraUpOrDirection(m_CamDir) )
  {
    return (v == m_CamDir);
  }

  if (v == ON_3dVector::UnsetVector)
  {
    m_CamDir = ON_3dVector::UnsetVector;
    m_projection_content_sha1 = ON_SHA1_Hash::ZeroDigest;
    m_bValidCameraFrame = false;
    m_bValidCamera = false;
  }
  else
  {
    m_CamDir = v;
    SetCameraFrame();
  }

  return m_bValidCamera;
}